

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.h
# Opt level: O3

TestResult *
JsonTest::checkEqual<char_const*,Json::Value>
          (TestResult *result,char *expected,Value *actual,char *file,uint line,char *expr)

{
  bool bVar1;
  TestResult *pTVar2;
  Value local_58;
  
  Json::Value::Value(&local_58,expected);
  bVar1 = Json::Value::operator!=(&local_58,actual);
  Json::Value::~Value(&local_58);
  if (bVar1) {
    TestResult::addFailure(result,file,line,expr);
    pTVar2 = TestResult::operator<<(result,(char (*) [11])"Expected: ");
    Json::Value::Value(&local_58,expected);
    pTVar2 = TestResult::operator<<(pTVar2,&local_58);
    TestResult::operator<<(pTVar2,(char (*) [2])0x14a14b);
    Json::Value::~Value(&local_58);
    pTVar2 = TestResult::operator<<(result,(char (*) [11])"Actual  : ");
    TestResult::operator<<(pTVar2,actual);
  }
  return result;
}

Assistant:

TestResult& checkEqual(TestResult& result,
                       T expected,
                       U actual,
                       const char* file,
                       unsigned int line,
                       const char* expr) {
  if (static_cast<U>(expected) != actual) {
    result.addFailure(file, line, expr);
    result << "Expected: " << static_cast<U>(expected) << "\n";
    result << "Actual  : " << actual;
  }
  return result;
}